

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

MixingHashState
absl::lts_20250127::hash_internal::HashStateBase<absl::lts_20250127::hash_internal::MixingHashState>
::combine<std::basic_string_view<char,std::char_traits<char>>,int>
          (MixingHashState state,basic_string_view<char,_std::char_traits<char>_> *value,int *values
          )

{
  enable_if_t<std::is_same<MixingHashState,_decltype(AbslHashValue(std::move(state),_value))>::value,_absl::lts_20250127::hash_internal::MixingHashState>
  state_00;
  MixingHashState MVar1;
  int *values_local;
  basic_string_view<char,_std::char_traits<char>_> *value_local;
  MixingHashState state_local;
  
  state_00 = HashSelect::HashValueProbe::
             Invoke<absl::lts_20250127::hash_internal::MixingHashState,std::basic_string_view<char,std::char_traits<char>>>
                       (state,value);
  MVar1 = combine<int>(state_00.state_,values);
  return (MixingHashState)MVar1.state_;
}

Assistant:

H HashStateBase<H>::combine(H state, const T& value, const Ts&... values) {
  return H::combine(hash_internal::HashSelect::template Apply<T>::Invoke(
                        std::move(state), value),
                    values...);
}